

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_collector.hpp
# Opt level: O0

void __thiscall
duckdb::BatchCollectorLocalState::BatchCollectorLocalState
          (BatchCollectorLocalState *this,ClientContext *context,PhysicalBatchCollector *op)

{
  undefined8 in_RSI;
  undefined1 buffer_managed_p;
  vector<duckdb::LogicalType,_true> *in_RDI;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffc0;
  ClientContext *in_stack_ffffffffffffffc8;
  BatchedDataCollection *in_stack_ffffffffffffffd0;
  
  buffer_managed_p = (undefined1)((ulong)in_RSI >> 0x38);
  LocalSinkState::LocalSinkState((LocalSinkState *)0x17f3cd1);
  (in_RDI->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__BatchCollectorLocalState_0352bb78;
  vector<duckdb::LogicalType,_true>::vector(in_RDI + 2,in_RDI);
  BatchedDataCollection::BatchedDataCollection
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (bool)buffer_managed_p);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x17f3d2d);
  return;
}

Assistant:

BatchCollectorLocalState(ClientContext &context, const PhysicalBatchCollector &op) : data(context, op.types) {
	}